

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_set_context(ptls_t *tls,ptls_context_t *ctx)

{
  ptls_context_t *in_RSI;
  undefined8 *in_RDI;
  ssize_t in_stack_ffffffffffffffe8;
  
  update_open_count(in_RSI,in_stack_ffffffffffffffe8);
  update_open_count(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = in_RSI;
  return;
}

Assistant:

void ptls_set_context(ptls_t *tls, ptls_context_t *ctx)
{
    update_open_count(ctx, 1);
    update_open_count(tls->ctx, -1);
    tls->ctx = ctx;
}